

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lumeview.cpp
# Opt level: O0

void __thiscall lumeview::Lumeview::render(Lumeview *this)

{
  bool bVar1;
  element_type *peVar2;
  View *pVVar3;
  anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2 local_18;
  vec2 clipDists;
  Lumeview *this_local;
  
  clipDists.field_0 = (anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2)this;
  (*glad_glEnable)(0xb71);
  (*glad_glClearColor)(0.25,0.25,0.25,1.0);
  (*glad_glClear)(0x4100);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_scene);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<lumeview::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lumeview::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_scene);
    pVVar3 = ArcBallView::view(&this->m_arcBallView);
    local_18.field_0 =
         (anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2_0
          )Scene::estimate_z_clip_dists(peVar2,pVVar3);
    pVVar3 = ArcBallView::view(&this->m_arcBallView);
    View::set_z_clip_dists(pVVar3,(vec2 *)&local_18.field_0);
    peVar2 = std::__shared_ptr_access<lumeview::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lumeview::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_scene);
    pVVar3 = ArcBallView::view(&this->m_arcBallView);
    Scene::render(peVar2,pVVar3);
  }
  ImGui_Display((ImDrawData *)0x0);
  return;
}

Assistant:

void Lumeview::render ()
{
	glEnable (GL_DEPTH_TEST);

	glClearColor (0.25f, 0.25f, 0.25f, 1.0f);
	glClear (GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

	if (m_scene) {
		const glm::vec2 clipDists = m_scene->estimate_z_clip_dists(m_arcBallView.view());
		m_arcBallView.view().set_z_clip_dists (clipDists);
		m_scene->render (m_arcBallView.view());
	}

	lumeview::ImGui_Display();
}